

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_pivot.c
# Opt level: O0

void __thiscall lu_remove_col(lu *this,lu_int j)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int in_ESI;
  long in_RDI;
  lu_int where;
  lu_int nz;
  lu_int pos;
  lu_int i;
  lu_int cend;
  lu_int cbeg;
  lu_int *Windex;
  lu_int *Wend;
  lu_int *Wbegin;
  double *colmax;
  lu_int *rowcount_blink;
  lu_int *rowcount_flink;
  lu_int *colcount_blink;
  lu_int *colcount_flink;
  lu_int m;
  undefined4 local_68;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa4;
  int iVar7;
  int iVar8;
  lu_int elem;
  long lVar9;
  
  iVar1 = *(int *)(in_RDI + 0x54);
  lVar2 = *(long *)(in_RDI + 0x2a8);
  lVar3 = *(long *)(in_RDI + 0x218);
  lVar4 = *(long *)(in_RDI + 0x228);
  lVar9 = *(long *)(in_RDI + 0x1b0);
  iVar7 = *(int *)(lVar4 + (long)in_ESI * 4);
  iVar5 = *(int *)(lVar3 + (long)in_ESI * 4);
  iVar8 = iVar5;
  for (; elem = (lu_int)((ulong)lVar9 >> 0x20), iVar5 < iVar7; iVar5 = iVar5 + 1) {
    in_stack_ffffffffffffffa4 = *(int *)(lVar9 + (long)iVar5 * 4);
    local_68 = *(int *)(lVar3 + (long)(iVar1 + in_stack_ffffffffffffffa4) * 4);
    while (*(int *)(lVar9 + (long)local_68 * 4) != in_ESI) {
      local_68 = local_68 + 1;
    }
    iVar6 = *(int *)(lVar4 + (long)(iVar1 + in_stack_ffffffffffffffa4) * 4) + -1;
    *(int *)(lVar4 + (long)(iVar1 + in_stack_ffffffffffffffa4) * 4) = iVar6;
    *(undefined4 *)(lVar9 + (long)local_68 * 4) = *(undefined4 *)(lVar9 + (long)iVar6 * 4);
    in_stack_ffffffffffffff9c =
         *(int *)(lVar4 + (long)(iVar1 + in_stack_ffffffffffffffa4) * 4) -
         *(int *)(lVar3 + (long)(iVar1 + in_stack_ffffffffffffffa4) * 4);
    lu_list_move(elem,(lu_int)lVar9,(lu_int *)CONCAT44(iVar8,iVar7),
                 (lu_int *)CONCAT44(in_stack_ffffffffffffffa4,iVar5),in_stack_ffffffffffffff9c,
                 (lu_int *)0x865741);
  }
  *(undefined8 *)(lVar2 + (long)in_ESI * 8) = 0;
  *(int *)(lVar4 + (long)in_ESI * 4) = iVar8;
  lu_list_move(elem,(lu_int)lVar9,(lu_int *)CONCAT44(iVar8,iVar7),
               (lu_int *)CONCAT44(in_stack_ffffffffffffffa4,iVar5),in_stack_ffffffffffffff9c,
               (lu_int *)0x86579a);
  return;
}

Assistant:

static void lu_remove_col(struct lu *this, lu_int j)
{
    const lu_int m          = this->m;
    lu_int *colcount_flink  = this->colcount_flink;
    lu_int *colcount_blink  = this->colcount_blink;
    lu_int *rowcount_flink  = this->rowcount_flink;
    lu_int *rowcount_blink  = this->rowcount_blink;
    double *colmax          = this->col_pivot;
    lu_int *Wbegin          = this->Wbegin;
    lu_int *Wend            = this->Wend;
    lu_int *Windex          = this->Windex;
    const lu_int cbeg       = Wbegin[j];
    const lu_int cend       = Wend[j];

    lu_int i, pos, nz, where;

    /* Remove column j from row file. */
    for (pos = cbeg; pos < cend; pos++)
    {
        i = Windex[pos];
        for (where = Wbegin[m+i]; Windex[where] != j; where++)
            assert(where < Wend[m+i]-1);
        Windex[where] = Windex[--Wend[m+i]];
        nz = Wend[m+i] - Wbegin[m+i];
        lu_list_move(i, nz, rowcount_flink, rowcount_blink, m,
                     &this->min_rownz);
    }

    /* Remove column j from column file. */
    colmax[j] = 0.0;
    Wend[j] = cbeg;
    lu_list_move(j, 0, colcount_flink, colcount_blink, m, &this->min_colnz);
}